

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::constraintsSecondPartialDerivativeWRTStateSparsity
          (OptimalControlProblem *this,SparsityStructure *stateSparsity)

{
  OptimalControlProblemPimpl *pOVar1;
  bool bVar2;
  _Base_ptr p_Var3;
  size_t numberOfRows;
  size_t numberOfColumns;
  _Self __tmp;
  ostringstream errorMsg;
  char *local_1c8 [4];
  ostringstream local_1a8 [376];
  
  p_Var3 = (this->m_pimpl->constraintsGroups)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar2 = true;
  do {
    pOVar1 = this->m_pimpl;
    if (bVar2 == false) {
      if ((pOVar1->dynamicalSystem).
          super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr == (element_type *)0x0) {
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::operator<<((ostream *)local_1a8,
                        "Not all groups have the hessian sparsity defined and no dynamical system has been provided yet. Cannot determine the sparsity since the state dimension is unknown."
                       );
        std::__cxx11::stringbuf::str();
        iDynTree::reportError
                  ("OptimalControlProblem","constraintsSecondPartialDerivativeWRTStateSparsity",
                   local_1c8[0]);
        std::__cxx11::string::~string((string *)local_1c8);
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
        bVar2 = false;
      }
      else {
        SparsityStructure::clear(&pOVar1->constraintsStateHessianSparsity);
        pOVar1 = this->m_pimpl;
        numberOfRows = DynamicalSystem::stateSpaceSize
                                 ((pOVar1->dynamicalSystem).
                                  super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr);
        numberOfColumns =
             DynamicalSystem::stateSpaceSize
                       ((this->m_pimpl->dynamicalSystem).
                        super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr);
        SparsityStructure::addDenseBlock
                  (&pOVar1->constraintsStateHessianSparsity,0,0,numberOfRows,numberOfColumns);
LAB_00182871:
        SparsityStructure::operator=(stateSparsity,&this->m_pimpl->constraintsStateHessianSparsity);
        bVar2 = true;
      }
      return bVar2;
    }
    if ((_Rb_tree_header *)p_Var3 == &(pOVar1->constraintsGroups)._M_t._M_impl.super__Rb_tree_header
       ) {
      SparsityStructure::clear(&pOVar1->constraintsStateHessianSparsity);
      pOVar1 = this->m_pimpl;
      for (p_Var3 = (pOVar1->constraintsGroups)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
          ; (_Rb_tree_header *)p_Var3 !=
            &(pOVar1->constraintsGroups)._M_t._M_impl.super__Rb_tree_header;
          p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
        SparsityStructure::merge
                  (&this->m_pimpl->constraintsStateHessianSparsity,
                   (SparsityStructure *)(*(long *)(p_Var3 + 2) + 0x1f0));
      }
      goto LAB_00182871;
    }
    bVar2 = ConstraintsGroup::constraintsSecondPartialDerivativeWRTStateSparsity
                      ((ConstraintsGroup *)**(undefined8 **)(p_Var3 + 2),
                       (SparsityStructure *)(*(undefined8 **)(p_Var3 + 2) + 0x3e));
    *(bool *)(*(long *)(p_Var3 + 2) + 0x328) = bVar2;
    p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
  } while( true );
}

Assistant:

bool OptimalControlProblem::constraintsSecondPartialDerivativeWRTStateSparsity(SparsityStructure &stateSparsity)
        {
            bool allHaveSparsity = true;

            auto group = m_pimpl->constraintsGroups.begin();

            while (allHaveSparsity && group != m_pimpl->constraintsGroups.end()) {
                group->second->hasStateHessianSparsity =
                    group->second->group_ptr->constraintsSecondPartialDerivativeWRTStateSparsity(group->second->stateHessianSparsity);
                allHaveSparsity &= group->second->hasStateHessianSparsity;
                group++;
            }

            if (allHaveSparsity) {
                m_pimpl->constraintsStateHessianSparsity.clear();

                for (auto& groupPtr : m_pimpl->constraintsGroups) {
                    m_pimpl->constraintsStateHessianSparsity.merge(groupPtr.second->stateHessianSparsity);
                }

            } else {
                if (m_pimpl->dynamicalSystem) {
                    m_pimpl->constraintsStateHessianSparsity.clear();
                    m_pimpl->constraintsStateHessianSparsity.addDenseBlock(0, 0, m_pimpl->dynamicalSystem->stateSpaceSize(), m_pimpl->dynamicalSystem->stateSpaceSize());
                } else {
                    std::ostringstream errorMsg;
                    errorMsg << "Not all groups have the hessian sparsity defined and no dynamical system has been provided yet. Cannot determine the sparsity since the state dimension is unknown.";
                    reportError("OptimalControlProblem", "constraintsSecondPartialDerivativeWRTStateSparsity", errorMsg.str().c_str());
                    return false;
                }
            }

            stateSparsity = m_pimpl->constraintsStateHessianSparsity;
            return true;
        }